

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeNonAtomicStore(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var1;
  double dVar2;
  int8_t iVar3;
  uint32_t uVar4;
  uint uVar5;
  Type type_00;
  Expression *pEVar6;
  Expression *pEVar7;
  Expression *pEVar8;
  long lVar9;
  ulong uVar10;
  undefined8 local_58;
  undefined8 uStack_50;
  
  if (type.id == 0) {
    type = getStorableType(this);
  }
  else if (type.id == 1) {
    type_00 = getStorableType(this);
    pEVar6 = makeNonAtomicStore(this,type_00);
    pEVar8 = (Expression *)0x0;
    if (pEVar6->_id == StoreId) {
      pEVar8 = pEVar6;
    }
    if (pEVar8 == (Expression *)0x0) {
      return pEVar6;
    }
    uVar4 = Random::upTo(&this->random,3);
    if (uVar4 == 0) {
      lVar9 = 0x30;
LAB_00144852:
      pEVar6 = make(this,(Type)0x1);
      *(Expression **)(&pEVar8->_id + lVar9) = pEVar6;
    }
    else {
      if (uVar4 == 2) {
        pEVar6 = make(this,(Type)0x1);
        *(Expression **)(pEVar8 + 3) = pEVar6;
LAB_00144846:
        lVar9 = 0x38;
        goto LAB_00144852;
      }
      if (uVar4 == 1) goto LAB_00144846;
    }
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    local_58._0_4_ =
         *(undefined4 *)
          _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    local_58._4_4_ =
         *(undefined4 *)
          ((long)_Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 4);
    uStack_50._0_4_ =
         *(undefined4 *)
          ((long)_Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    uStack_50._4_4_ =
         *(undefined4 *)
          ((long)_Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0xc);
    goto LAB_00144871;
  }
  this_00 = &this->random;
  iVar3 = Random::get(this_00);
  dVar2 = log((double)(iVar3 + 1 + (uint)(iVar3 == -1)));
  dVar2 = floor(dVar2);
  pEVar6 = makePointer(this);
  pEVar7 = make(this,type);
  if (6 < type.id) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  if (6 < (uint)type.id) {
    wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xbf3);
  }
  uVar10 = (ulong)dVar2;
  switch(type.id & 0xffffffff) {
  default:
    wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xbf1);
  case 2:
    uVar4 = Random::upTo(this_00,3);
    if (uVar4 == 2) goto switchD_001444a8_caseD_4;
    if (uVar4 == 1) goto switchD_00144535_caseD_1;
    if (uVar4 != 0) {
      wasm::handle_unreachable
                ("invalid value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xbc3);
    }
switchD_00144535_caseD_0:
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    local_58 = *(undefined8 *)
                _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uStack_50 = *(undefined8 *)
                 ((long)_Var1.
                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x58,8);
    *(undefined8 *)pEVar8 = 0;
    (pEVar8->type).id = 0;
    *(undefined8 *)(pEVar8 + 2) = 0;
    pEVar8[2].type.id = 0;
    *(undefined8 *)(pEVar8 + 1) = 0;
    pEVar8[1].type.id = 0;
    *(undefined8 *)(pEVar8 + 3) = 0;
    pEVar8[3].type.id = 0;
    *(undefined8 *)(pEVar8 + 4) = 0;
    pEVar8[4].type.id = 0;
    *(undefined8 *)(pEVar8 + 5) = 0;
    pEVar8->_id = StoreId;
    (pEVar8->type).id = 0;
    pEVar8[1].type.id = 0;
    *(undefined8 *)(pEVar8 + 2) = 0;
    *(undefined1 *)&pEVar8[2].type.id = 0;
    pEVar8[1]._id = BlockId;
    pEVar8[1].type.id = uVar10 & 0xffffffff;
    *(undefined8 *)(pEVar8 + 2) = 1;
    goto LAB_0014481b;
  case 3:
    uVar4 = Random::upTo(this_00,4);
    switch(uVar4) {
    case 0:
      goto switchD_00144535_caseD_0;
    case 1:
switchD_00144535_caseD_1:
      uVar5 = Random::pick<int,int>(this_00,1,2);
      _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
      local_58 = *(undefined8 *)
                  _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                  .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      uStack_50 = *(undefined8 *)
                   ((long)_Var1.
                          super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                          .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
      pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x58,8);
      *(undefined8 *)pEVar8 = 0;
      (pEVar8->type).id = 0;
      *(undefined8 *)(pEVar8 + 2) = 0;
      pEVar8[2].type.id = 0;
      *(undefined8 *)(pEVar8 + 1) = 0;
      pEVar8[1].type.id = 0;
      *(undefined8 *)(pEVar8 + 3) = 0;
      pEVar8[3].type.id = 0;
      *(undefined8 *)(pEVar8 + 4) = 0;
      pEVar8[4].type.id = 0;
      *(undefined8 *)(pEVar8 + 5) = 0;
      pEVar8->_id = StoreId;
      (pEVar8->type).id = 0;
      pEVar8[1].type.id = 0;
      *(undefined8 *)(pEVar8 + 2) = 0;
      *(undefined1 *)&pEVar8[2].type.id = 0;
      pEVar8[1]._id = IfId;
      break;
    case 2:
      goto switchD_001444a8_caseD_4;
    case 3:
      goto switchD_001444a8_caseD_5;
    default:
      wasm::handle_unreachable
                ("invalid value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xbd9);
    }
    break;
  case 4:
switchD_001444a8_caseD_4:
    uVar5 = Random::pick<int,int,int>(this_00,1,2,4);
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    local_58 = *(undefined8 *)
                _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uStack_50 = *(undefined8 *)
                 ((long)_Var1.
                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x58,8);
    *(undefined8 *)pEVar8 = 0;
    (pEVar8->type).id = 0;
    *(undefined8 *)(pEVar8 + 2) = 0;
    pEVar8[2].type.id = 0;
    *(undefined8 *)(pEVar8 + 1) = 0;
    pEVar8[1].type.id = 0;
    *(undefined8 *)(pEVar8 + 3) = 0;
    pEVar8[3].type.id = 0;
    *(undefined8 *)(pEVar8 + 4) = 0;
    pEVar8[4].type.id = 0;
    *(undefined8 *)(pEVar8 + 5) = 0;
    pEVar8->_id = StoreId;
    (pEVar8->type).id = 0;
    pEVar8[1].type.id = 0;
    *(undefined8 *)(pEVar8 + 2) = 0;
    *(undefined1 *)&pEVar8[2].type.id = 0;
    pEVar8[1]._id = BreakId;
    break;
  case 5:
switchD_001444a8_caseD_5:
    uVar5 = Random::pick<int,int,int,int>(this_00,1,2,4,8);
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    local_58 = *(undefined8 *)
                _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uStack_50 = *(undefined8 *)
                 ((long)_Var1.
                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x58,8);
    *(undefined8 *)pEVar8 = 0;
    (pEVar8->type).id = 0;
    *(undefined8 *)(pEVar8 + 2) = 0;
    pEVar8[2].type.id = 0;
    *(undefined8 *)(pEVar8 + 1) = 0;
    pEVar8[1].type.id = 0;
    *(undefined8 *)(pEVar8 + 3) = 0;
    pEVar8[3].type.id = 0;
    *(undefined8 *)(pEVar8 + 4) = 0;
    pEVar8[4].type.id = 0;
    *(undefined8 *)(pEVar8 + 5) = 0;
    pEVar8->_id = StoreId;
    (pEVar8->type).id = 0;
    pEVar8[1].type.id = 0;
    *(undefined8 *)(pEVar8 + 2) = 0;
    *(undefined1 *)&pEVar8[2].type.id = 0;
    pEVar8[1]._id = LocalGetId;
    break;
  case 6:
    if (((this->wasm->features).features & 8) == 0) {
      pEVar8 = makeTrivial(this,type);
      return pEVar8;
    }
    uVar5 = Random::pick<int,int,int,int,int>(this_00,1,2,4,8,0x10);
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    local_58 = *(undefined8 *)
                _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uStack_50 = *(undefined8 *)
                 ((long)_Var1.
                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x58,8);
    *(undefined8 *)pEVar8 = 0;
    (pEVar8->type).id = 0;
    *(undefined8 *)(pEVar8 + 2) = 0;
    pEVar8[2].type.id = 0;
    *(undefined8 *)(pEVar8 + 1) = 0;
    pEVar8[1].type.id = 0;
    *(undefined8 *)(pEVar8 + 3) = 0;
    pEVar8[3].type.id = 0;
    *(undefined8 *)(pEVar8 + 4) = 0;
    pEVar8[4].type.id = 0;
    *(undefined8 *)(pEVar8 + 5) = 0;
    pEVar8->_id = StoreId;
    (pEVar8->type).id = 0;
    pEVar8[1].type.id = 0;
    *(undefined8 *)(pEVar8 + 2) = 0;
    *(undefined1 *)&pEVar8[2].type.id = 0;
    pEVar8[1]._id = BinaryId;
    pEVar8[1].type.id = uVar10 & 0xffffffff;
    *(ulong *)(pEVar8 + 2) = (ulong)uVar5;
LAB_0014481b:
    *(Expression **)(pEVar8 + 3) = pEVar6;
    pEVar8[3].type.id = (uintptr_t)pEVar7;
    goto LAB_00144829;
  }
  pEVar8[1].type.id = uVar10 & 0xffffffff;
  *(ulong *)(pEVar8 + 2) = (ulong)uVar5;
  *(Expression **)(pEVar8 + 3) = pEVar6;
  pEVar8[3].type.id = (uintptr_t)pEVar7;
LAB_00144829:
  *(uintptr_t *)(pEVar8 + 4) = type.id;
LAB_00144871:
  *(undefined4 *)&pEVar8[4].type.id = (undefined4)local_58;
  *(undefined4 *)((long)&pEVar8[4].type.id + 4) = local_58._4_4_;
  *(undefined4 *)(pEVar8 + 5) = (undefined4)uStack_50;
  *(undefined4 *)&pEVar8[5].field_0x4 = uStack_50._4_4_;
  wasm::Store::finalize();
  return pEVar8;
}

Assistant:

Expression* TranslateToFuzzReader::makeNonAtomicStore(Type type) {
  if (type == Type::unreachable) {
    // make a normal store, then make it unreachable
    auto* ret = makeNonAtomicStore(getStorableType());
    auto* store = ret->dynCast<Store>();
    if (!store) {
      return ret;
    }
    switch (upTo(3)) {
      case 0:
        store->ptr = make(Type::unreachable);
        break;
      case 1:
        store->value = make(Type::unreachable);
        break;
      case 2:
        store->ptr = make(Type::unreachable);
        store->value = make(Type::unreachable);
        break;
    }
    store->memory = wasm.memories[0]->name;
    store->finalize();
    return store;
  }
  // the type is none or unreachable. we also need to pick the value
  // type.
  if (type == Type::none) {
    type = getStorableType();
  }
  auto offset = logify(get());
  auto ptr = makePointer();
  auto value = make(type);
  switch (type.getBasic()) {
    case Type::i32: {
      switch (upTo(3)) {
        case 0:
          return builder.makeStore(
            1, offset, 1, ptr, value, type, wasm.memories[0]->name);
        case 1:
          return builder.makeStore(
            2, offset, pick(1, 2), ptr, value, type, wasm.memories[0]->name);
        case 2:
          return builder.makeStore(
            4, offset, pick(1, 2, 4), ptr, value, type, wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::i64: {
      switch (upTo(4)) {
        case 0:
          return builder.makeStore(
            1, offset, 1, ptr, value, type, wasm.memories[0]->name);
        case 1:
          return builder.makeStore(
            2, offset, pick(1, 2), ptr, value, type, wasm.memories[0]->name);
        case 2:
          return builder.makeStore(
            4, offset, pick(1, 2, 4), ptr, value, type, wasm.memories[0]->name);
        case 3:
          return builder.makeStore(8,
                                   offset,
                                   pick(1, 2, 4, 8),
                                   ptr,
                                   value,
                                   type,
                                   wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::f32: {
      return builder.makeStore(
        4, offset, pick(1, 2, 4), ptr, value, type, wasm.memories[0]->name);
    }
    case Type::f64: {
      return builder.makeStore(
        8, offset, pick(1, 2, 4, 8), ptr, value, type, wasm.memories[0]->name);
    }
    case Type::v128: {
      if (!wasm.features.hasSIMD()) {
        return makeTrivial(type);
      }
      return builder.makeStore(16,
                               offset,
                               pick(1, 2, 4, 8, 16),
                               ptr,
                               value,
                               type,
                               wasm.memories[0]->name);
    }
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("invalid type");
  }
  WASM_UNREACHABLE("invalid type");
}